

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_algorithm_suite.cpp
# Opt level: O0

void copy_suite::rotate_copy(void)

{
  initializer_list<int> __l;
  basic_iterator<int> __middle;
  initializer_list<int> input;
  iterator_type *piVar1;
  back_insert_iterator<vista::circular_view<int,_18446744073709551615UL>_> __result;
  iterator second_begin;
  iterator second_end;
  iterator iVar2;
  iterator first_end;
  allocator<int> local_121;
  int local_120 [4];
  iterator local_110;
  size_type local_108;
  undefined1 local_100 [8];
  vector<int,_std::allocator<int>_> expect;
  iterator local_c8;
  view_pointer local_b8;
  size_type sStack_b0;
  iterator local_a8;
  undefined1 local_98 [8];
  circular_view<int,_18446744073709551615UL> copy;
  int copy_array [4];
  undefined1 local_38 [8];
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  
  span.member.next = 0;
  vista::circular_view<int,_18446744073709551615UL>::circular_view<4UL,_0>
            ((circular_view<int,_18446744073709551615UL> *)local_38,
             (value_type (*) [4])&span.member.next);
  copy_array[2] = 0xb;
  copy_array[3] = 0x16;
  input._M_len = 5;
  input._M_array = copy_array + 2;
  vista::circular_view<int,_18446744073709551615UL>::operator=
            ((circular_view<int,_18446744073709551615UL> *)local_38,input);
  vista::circular_view<int,_18446744073709551615UL>::circular_view<4UL,_0>
            ((circular_view<int,_18446744073709551615UL> *)local_98,
             (value_type (*) [4])&copy.member.next);
  local_a8 = vista::circular_view<int,_18446744073709551615UL>::begin
                       ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_c8 = vista::circular_view<int,_18446744073709551615UL>::begin
                       ((circular_view<int,_18446744073709551615UL> *)local_38);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++
                     (&local_c8);
  local_b8 = piVar1->parent;
  sStack_b0 = piVar1->current;
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::end
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  __result = std::back_inserter<vista::circular_view<int,18446744073709551615ul>>
                       ((circular_view<int,_18446744073709551615UL> *)local_98);
  __middle.current = sStack_b0;
  __middle.parent = local_b8;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::
                rotate_copy<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,std::back_insert_iterator<vista::circular_view<int,18446744073709551615ul>>>
                          (local_a8,__middle,iVar2,__result);
  local_120[0] = 0x21;
  local_120[1] = 0x2c;
  local_120[2] = 0x37;
  local_120[3] = 0x16;
  local_110 = local_120;
  local_108 = 4;
  std::allocator<int>::allocator(&local_121);
  __l._M_len = local_108;
  __l._M_array = local_110;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_100,__l,&local_121);
  std::allocator<int>::~allocator(&local_121);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)local_98);
  first_end = vista::circular_view<int,_18446744073709551615UL>::end
                        ((circular_view<int,_18446744073709551615UL> *)local_98);
  second_begin = std::vector<int,_std::allocator<int>_>::begin
                           ((vector<int,_std::allocator<int>_> *)local_100);
  second_end = std::vector<int,_std::allocator<int>_>::end
                         ((vector<int,_std::allocator<int>_> *)local_100);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0xba,"void copy_suite::rotate_copy()",iVar2,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             second_begin._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             second_end._M_current);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_100);
  return;
}

Assistant:

void rotate_copy()
{
    int array[4] = {};
    circular_view<int> span(array);
    span = { 11, 22, 33, 44, 55 };
    int copy_array[4];
    circular_view<int> copy(copy_array);
    std::rotate_copy(span.begin(), ++span.begin(), span.end(), std::back_inserter(copy));
    {
        std::vector<int> expect = { 33, 44, 55, 22 };
        BOOST_TEST_ALL_EQ(copy.begin(), copy.end(),
                          expect.begin(), expect.end());
    }
}